

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderIsolines.cpp
# Opt level: O3

IterateResult __thiscall
glcts::TessellationShadersIsolines::iterate(TessellationShadersIsolines *this)

{
  int iVar1;
  deUint32 dVar2;
  uint uVar3;
  undefined4 extraout_var;
  mapped_type *this_00;
  _Base_ptr p_Var5;
  TessellationShadersIsolines *this_01;
  _tessellation_shader_vertex_spacing *__k;
  _Base_ptr p_Var6;
  vector<char,_std::allocator<char>_> rendered_data;
  undefined1 local_88 [24];
  pointer pfStack_70;
  pointer local_68;
  undefined8 uStack_60;
  int local_58;
  _Base_ptr local_50;
  _test_results_per_vertex_spacing_map *local_48;
  _Base_ptr local_40;
  GLint gl_max_tess_gen_level_value;
  long lVar4;
  
  iVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar1);
  initTest(this);
  (**(code **)(lVar4 + 0xfd8))((this->super_TestCaseBase).m_glExtTokens.PATCH_VERTICES,1);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glPatchParameteriEXT() failed for GL_PATCH_VERTICES_EXT pname",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderIsolines.cpp"
                  ,0x296);
  (**(code **)(lVar4 + 0x5e0))(0x8c89);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glEnable(GL_RASTERIZER_DISCARD) failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderIsolines.cpp"
                  ,0x29a);
  gl_max_tess_gen_level_value = 0;
  (**(code **)(lVar4 + 0x868))((this->super_TestCaseBase).m_glExtTokens.MAX_TESS_GEN_LEVEL);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glGetIntegerv() failed for GL_MAX_TESS_GEN_LEVEL_EXT pname.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderIsolines.cpp"
                  ,0x2a0);
  p_Var5 = (this->m_tests)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_50 = &(this->m_tests)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (p_Var5 != local_50) {
    local_48 = &this->m_test_results;
    do {
      if (p_Var5[1]._M_parent != p_Var5[1]._M_left) {
        __k = (_tessellation_shader_vertex_spacing *)&p_Var5[1]._M_parent[1].field_0x4;
        local_40 = p_Var5;
        do {
          uVar3 = TessellationShaderUtils::getAmountOfVerticesGeneratedByTessellator
                            (this->m_utils_ptr,TESSELLATION_SHADER_PRIMITIVE_MODE_FIRST,
                             (float *)(__k + -7),(float *)(__k + -4),*__k,false);
          TessellationShaderUtils::getDataGeneratedByTessellator
                    (&rendered_data,this->m_utils_ptr,(float *)(__k + -7),false,
                     TESSELLATION_SHADER_PRIMITIVE_MODE_FIRST,
                     TESSELLATION_SHADER_VERTEX_ORDERING_CCW,*__k,(float *)(__k + -4));
          local_68 = (pointer)0x0;
          local_88._16_8_ = (TessellationShadersIsolines *)0x0;
          pfStack_70 = (pointer)0x0;
          local_88._0_8_ = (ulong)uVar3 << 0x20;
          uStack_60._4_4_ = (int)(float)((ulong)*(undefined8 *)(__k + -5) >> 0x20);
          uStack_60._0_4_ = (int)(float)*(undefined8 *)(__k + -5);
          local_58 = (int)(float)__k[-3];
          this_01 = (TessellationShadersIsolines *)(local_88 + 0x10);
          local_88._8_8_ = (_test_descriptor *)(__k + -9);
          std::vector<float,_std::allocator<float>_>::resize
                    ((vector<float,_std::allocator<float>_> *)this_01,
                     (ulong)((long)rendered_data.super__Vector_base<char,_std::allocator<char>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                            (long)rendered_data.super__Vector_base<char,_std::allocator<char>_>.
                                  _M_impl.super__Vector_impl_data._M_start) >> 2);
          if ((long)rendered_data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)rendered_data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start != 0) {
            this_01 = (TessellationShadersIsolines *)local_88._16_8_;
            memcpy((void *)local_88._16_8_,
                   rendered_data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   (long)rendered_data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)rendered_data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start);
          }
          countIsolines(this_01,(_test_result *)local_88);
          this_00 = std::
                    map<glcts::_tessellation_shader_vertex_spacing,_std::vector<glcts::TessellationShadersIsolines::_test_result,_std::allocator<glcts::TessellationShadersIsolines::_test_result>_>,_std::less<glcts::_tessellation_shader_vertex_spacing>,_std::allocator<std::pair<const_glcts::_tessellation_shader_vertex_spacing,_std::vector<glcts::TessellationShadersIsolines::_test_result,_std::allocator<glcts::TessellationShadersIsolines::_test_result>_>_>_>_>
                    ::operator[](local_48,__k);
          std::
          vector<glcts::TessellationShadersIsolines::_test_result,_std::allocator<glcts::TessellationShadersIsolines::_test_result>_>
          ::push_back(this_00,(value_type *)local_88);
          if ((TessellationShadersIsolines *)local_88._16_8_ != (TessellationShadersIsolines *)0x0)
          {
            operator_delete((void *)local_88._16_8_,(long)local_68 - local_88._16_8_);
          }
          if (rendered_data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(rendered_data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)rendered_data.super__Vector_base<char,_std::allocator<char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)rendered_data.super__Vector_base<char,_std::allocator<char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          p_Var6 = (_Base_ptr)(__k + 1);
          p_Var5 = local_40;
          __k = __k + 10;
        } while (p_Var6 != local_40[1]._M_left);
      }
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
    } while (p_Var5 != local_50);
  }
  runForAllTestResults(this,checkFirstOuterTessellationLevelEffect);
  runForAllTestResults(this,checkSecondOuterTessellationLevelEffect);
  checkIrrelevantTessellationLevelsHaveNoEffect(this);
  checkVertexSpacingDoesNotAffectAmountOfGeneratedIsolines(this);
  runForAllTestResults(this,checkNoLineSegmentIsDefinedAtHeightOne);
  tcu::TestContext::setTestResult
            ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult TessellationShadersIsolines::iterate(void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	initTest();

	/* We only need to use one vertex per so go for it */
	gl.patchParameteri(m_glExtTokens.PATCH_VERTICES, 1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glPatchParameteriEXT() failed for GL_PATCH_VERTICES_EXT pname");

	/* We don't need to rasterize anything in this test */
	gl.enable(GL_RASTERIZER_DISCARD);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEnable(GL_RASTERIZER_DISCARD) failed");

	/* Retrieve GL_MAX_TESS_GEN_LEVEL_EXT value before we continue */
	glw::GLint gl_max_tess_gen_level_value = 0;

	gl.getIntegerv(m_glExtTokens.MAX_TESS_GEN_LEVEL, &gl_max_tess_gen_level_value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_MAX_TESS_GEN_LEVEL_EXT pname.");

	/* To perform actual tests, we need to first retrieve the tessellated coordinates data.
	 * Run all tests configured and fill per-test buffer with the information.
	 **/
	for (_tests_per_vertex_spacing_map_iterator vs_key_iterator = m_tests.begin(); vs_key_iterator != m_tests.end();
		 vs_key_iterator++)
	{
		for (_tests_const_iterator test_iterator = vs_key_iterator->second.begin();
			 test_iterator != vs_key_iterator->second.end(); test_iterator++)
		{
			const _test_descriptor& test = *test_iterator;

			/* Capture tessellation data for considered configuration */
			unsigned int n_rendered_vertices = m_utils_ptr->getAmountOfVerticesGeneratedByTessellator(
				TESSELLATION_SHADER_PRIMITIVE_MODE_ISOLINES, test.inner_tess_levels, test.outer_tess_levels,
				test.vertex_spacing_mode, false); /* is_point_mode_enabled */
			std::vector<char> rendered_data = m_utils_ptr->getDataGeneratedByTessellator(
				test.inner_tess_levels, false, /* point mode */
				TESSELLATION_SHADER_PRIMITIVE_MODE_ISOLINES, TESSELLATION_SHADER_VERTEX_ORDERING_CCW,
				test.vertex_spacing_mode, test.outer_tess_levels);

			/* Store the data in a test result descriptor */
			_test_result result;

			result.n_vertices			 = n_rendered_vertices;
			result.parent				 = &test;
			result.irrelevant_tess_level = (int)test.irrelevant_tess_level;
			result.outer1_tess_level	 = (int)test.outer_tess_levels[0];
			result.outer2_tess_level	 = (int)test.outer_tess_levels[1];
			result.rendered_data.resize(rendered_data.size() / sizeof(float));
			if (0 != rendered_data.size())
			{
				memcpy(&result.rendered_data[0], &rendered_data[0], rendered_data.size());
			}
			countIsolines(result);

			/* Store the test run descriptor. */
			m_test_results[test.vertex_spacing_mode].push_back(result);
		}
	}

	/* Now we can proceed with actual tests */
	/* (test 1): Make sure amount of isolines is determined by first outer tessellation level */
	runForAllTestResults(checkFirstOuterTessellationLevelEffect);

	/* (test 2): Make sure amount of line segments per height is determined by second outer
	 *           tessellation level.
	 */
	runForAllTestResults(checkSecondOuterTessellationLevelEffect);

	/* (test 3): Make sure 3rd, 4th outer tessellation levels, as well as all inner tessellation
	 *           levels have no impact on the tessellated coordinates */
	checkIrrelevantTessellationLevelsHaveNoEffect();

	/* (test 4): Make sure no matter what vertex spacing is requested in TC stage, it is always
	 *           equal_spacing that is applied.
	 */
	checkVertexSpacingDoesNotAffectAmountOfGeneratedIsolines();

	/* (test 5): Make sure that no data set features a line segment at height of 1. */
	runForAllTestResults(checkNoLineSegmentIsDefinedAtHeightOne);

	/* All done */
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}